

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label.cpp
# Opt level: O1

optional<jhu::thrax::(anonymous_namespace)::Concat> *
jhu::thrax::anon_unknown_0::concatenation
          (optional<jhu::thrax::(anonymous_namespace)::Concat> *__return_storage_ptr__,Tree *tree,
          Span nt)

{
  short sVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  long lVar5;
  difference_type __d_2;
  ulong uVar6;
  pointer pNVar7;
  short sVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar12;
  pointer unaff_R12;
  pointer pNVar13;
  pointer unaff_R13;
  pointer pNVar14;
  optional<jhu::thrax::(anonymous_namespace)::Constituent> b;
  _Storage<jhu::thrax::(anonymous_namespace)::Constituent,_true> local_70;
  char local_60;
  ulong uVar11;
  
  pNVar7 = (tree->super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(tree->super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pNVar7 >> 5;
  do {
    pNVar13 = pNVar7;
    pNVar14 = pNVar7;
    if ((long)uVar6 < 1) break;
    uVar9 = uVar6 >> 1;
    sVar1 = pNVar7[uVar9].span.start;
    sVar8 = nt.start;
    if (sVar1 < sVar8) {
      lVar5 = uVar9 + 1;
      bVar4 = true;
      uVar9 = uVar6 + ~uVar9;
      pNVar7 = pNVar7 + lVar5;
    }
    else {
      bVar4 = true;
      if (sVar1 <= sVar8) {
        uVar11 = uVar9;
        unaff_R12 = pNVar7;
        if (uVar6 != 1) {
          do {
            uVar10 = uVar11 >> 1;
            uVar12 = uVar10;
            if (unaff_R12[uVar10].span.start < sVar8) {
              uVar12 = ~uVar10 + uVar11;
              unaff_R12 = unaff_R12 + uVar10 + 1;
            }
            uVar11 = uVar12;
          } while (0 < (long)uVar12);
        }
        unaff_R13 = pNVar7 + uVar9 + 1;
        uVar9 = (long)(pNVar7 + uVar6) - (long)unaff_R13 >> 5;
        while (uVar11 = uVar9, 0 < (long)uVar11) {
          uVar9 = uVar11 >> 1;
          if (unaff_R13[uVar9].span.start <= sVar8) {
            unaff_R13 = unaff_R13 + uVar9 + 1;
            uVar9 = ~uVar9 + uVar11;
          }
        }
        bVar4 = false;
        uVar9 = uVar6;
        pNVar7 = pNVar7 + uVar6;
      }
    }
    uVar6 = uVar9;
    pNVar13 = unaff_R12;
    pNVar14 = unaff_R13;
  } while (bVar4);
  if (pNVar13 < pNVar14) {
    do {
      constituent((optional<jhu::thrax::(anonymous_namespace)::Constituent> *)&local_70._M_value,
                  tree,(Span)((uint)(ushort)(pNVar13->span).end | (uint)nt & 0xffff0000));
      if (local_60 == '\x01') {
        sVar2 = (pNVar13->label)._M_len;
        pcVar3 = (pNVar13->label)._M_str;
        (__return_storage_ptr__->
        super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
        super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_payload._M_value.
        b._M_len = local_70._M_value.label._M_len;
        (__return_storage_ptr__->
        super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
        super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_payload._M_value.
        b._M_str = local_70._M_value.label._M_str;
        (__return_storage_ptr__->
        super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
        super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_payload._M_value.
        a._M_len = sVar2;
        (__return_storage_ptr__->
        super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
        super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_payload._M_value.
        a._M_str = pcVar3;
        (__return_storage_ptr__->
        super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
        super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_engaged = true;
        return __return_storage_ptr__;
      }
      pNVar13 = pNVar13 + 1;
    } while (pNVar13 < pNVar14);
  }
  (__return_storage_ptr__->
  super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
  super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<Concat> concatenation(const Tree& tree, Span nt) {
  auto [s, e] = std::equal_range(
      tree.begin(), tree.end(), Node{ nt, {}, nullptr }, byStart);
  for (auto it = s; it < e; it++) {
    auto b = constituent(tree, Span{ it->span.end, nt.end });
    if (b.has_value()) {
      return Concat{ it->label, b->label };
    }
  }
  return {};
}